

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void timediffFunc(sqlite3_context *context,int NotUsed1,sqlite3_value **argv)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  uint local_bc;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 local_98 [12];
  int iStack_8c;
  undefined1 *local_88;
  undefined1 *puStack_80;
  double local_78;
  undefined1 *local_70;
  undefined1 local_68 [12];
  int iStack_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  double local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = -NAN;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = -NAN;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar3 = isDate(context,1,argv,(DateTime *)local_68);
  if (iVar3 == 0) {
    iVar3 = isDate(context,1,argv + 1,(DateTime *)local_98);
    if (iVar3 == 0) {
      computeYMD((DateTime *)local_68);
      computeHMS((DateTime *)local_68);
      computeYMD((DateTime *)local_98);
      computeHMS((DateTime *)local_98);
      uVar2 = local_68._0_8_;
      if ((long)local_68._0_8_ < (long)local_98._0_8_) {
        iVar3 = local_98._8_4_ - local_68._8_4_;
        if (iVar3 != 0) {
          stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_8c,local_68._8_4_);
          local_70 = (undefined1 *)((ulong)local_70._1_7_ << 8);
          computeJD((DateTime *)local_98);
        }
        uVar5 = iStack_8c - iStack_5c;
        uVar6 = uVar5 + 0xc;
        if (-1 < (int)uVar5) {
          uVar6 = uVar5;
        }
        uVar7 = (ulong)uVar6;
        if (uVar6 != 0) {
          stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_5c,local_98._8_4_);
          local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
          computeJD((DateTime *)local_98);
        }
        uVar6 = iVar3 + ((int)uVar5 >> 0x1f);
        if ((long)local_98._0_8_ < (long)uVar2) {
          do {
            iVar3 = (int)uVar7;
            uVar5 = iVar3 - 1;
            if (iVar3 < 1) {
              uVar5 = 0xb;
            }
            uVar7 = (ulong)uVar5;
            iVar1 = iStack_8c;
            stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_8c + 1,local_98._8_4_);
            if (0xb < iVar1) {
              stack0xffffffffffffff70 = (undefined1 *)CONCAT44(1,local_98._8_4_ + 1);
            }
            uVar6 = uVar6 - (iVar3 < 1);
            local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
            computeJD((DateTime *)local_98);
          } while ((long)local_98._0_8_ < (long)uVar2);
        }
        lVar4 = local_98._0_8_ - uVar2;
        local_bc = 0x2d;
      }
      else {
        iVar3 = local_68._8_4_ - local_98._8_4_;
        if (iVar3 != 0) {
          stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_8c,local_68._8_4_);
          local_70 = (undefined1 *)((ulong)local_70._1_7_ << 8);
          computeJD((DateTime *)local_98);
        }
        uVar5 = iStack_5c - iStack_8c;
        uVar6 = (iStack_5c + 0xc) - iStack_8c;
        if (-1 < (int)uVar5) {
          uVar6 = uVar5;
        }
        uVar7 = (ulong)uVar6;
        if (uVar6 != 0) {
          stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_5c,local_98._8_4_);
          local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
          computeJD((DateTime *)local_98);
        }
        uVar6 = iVar3 + ((int)uVar5 >> 0x1f);
        if ((long)uVar2 < (long)local_98._0_8_) {
          do {
            iVar3 = (int)uVar7;
            uVar5 = iVar3 - 1;
            if (iVar3 < 1) {
              uVar5 = 0xb;
            }
            uVar7 = (ulong)uVar5;
            iVar1 = iStack_8c;
            stack0xffffffffffffff70 = (undefined1 *)CONCAT44(iStack_8c + -1,local_98._8_4_);
            if (iVar1 < 2) {
              stack0xffffffffffffff70 = (undefined1 *)CONCAT44(0xc,local_98._8_4_ + -1);
            }
            uVar6 = uVar6 - (iVar3 < 1);
            local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
            computeJD((DateTime *)local_98);
          } while ((long)uVar2 < (long)local_98._0_8_);
        }
        lVar4 = uVar2 - local_98._0_8_;
        local_bc = 0x2b;
      }
      local_68._0_8_ = lVar4 + 0x873dcf4ec200;
      local_40._0_3_ = (uint3)(byte)local_40;
      puStack_50 = (undefined1 *)(ulong)(uint)puStack_50;
      computeYMD((DateTime *)local_68);
      computeHMS((DateTime *)local_68);
      local_b8._0_8_ = (sqlite3 *)0x0;
      local_b8._8_8_ = (char *)0x0;
      local_a8 = (undefined1 *)0x6400000000;
      puStack_a0 = (undefined1 *)((ulong)puStack_a0 & 0xffff000000000000);
      sqlite3_str_appendf((StrAccum *)local_b8,"%c%04d-%02d-%02d %02d:%02d:%06.3f",SUB84(local_48,0)
                          ,(ulong)local_bc,(ulong)uVar6,uVar7,(ulong)((int)local_58 - 1),
                          (ulong)local_58 >> 0x20,(ulong)puStack_50 & 0xffffffff);
      sqlite3ResultStrAccum(context,(StrAccum *)local_b8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void timediffFunc(
  sqlite3_context *context,
  int NotUsed1,
  sqlite3_value **argv
){
  char sign;
  int Y, M;
  DateTime d1, d2;
  sqlite3_str sRes;
  UNUSED_PARAMETER(NotUsed1);
  if( isDate(context, 1, &argv[0], &d1) ) return;
  if( isDate(context, 1, &argv[1], &d2) ) return;
  computeYMD_HMS(&d1);
  computeYMD_HMS(&d2);
  if( d1.iJD>=d2.iJD ){
    sign = '+';
    Y = d1.Y - d2.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d1.M - d2.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD<d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M--;
      if( d2.M<1 ){
        d2.M = 12;
        d2.Y--;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD -= d2.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }else /* d1<d2 */{
    sign = '-';
    Y = d2.Y - d1.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d2.M - d1.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD>d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M++;
      if( d2.M>12 ){
        d2.M = 1;
        d2.Y++;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD = d2.iJD - d1.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }
  clearYMD_HMS_TZ(&d1);
  computeYMD_HMS(&d1);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, 100);
  sqlite3_str_appendf(&sRes, "%c%04d-%02d-%02d %02d:%02d:%06.3f",
       sign, Y, M, d1.D-1, d1.h, d1.m, d1.s);
  sqlite3ResultStrAccum(context, &sRes);
}